

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O2

bool djgt_save_png(djg_texture *texture,char *filename)

{
  djg_texture *pdVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  char buf [1024];
  
  pdVar1 = texture->next;
  iVar2 = djgt__count(texture);
  if (iVar2 == 1) {
    sprintf(buf,"%s.png",filename);
    iVar2 = stbi_write_png(buf,pdVar1->x,pdVar1->y,pdVar1->comp,pdVar1->texels,0);
    bVar4 = iVar2 != 0;
  }
  else if (pdVar1 == (djg_texture *)0x0) {
    bVar4 = true;
  }
  else {
    iVar2 = 1;
    bVar4 = false;
    do {
      sprintf(buf,"%s_layer%03i.png",filename,iVar2);
      iVar2 = iVar2 + 1;
      iVar3 = stbi_write_png(buf,pdVar1->x,pdVar1->y,pdVar1->comp,pdVar1->texels,0);
    } while (iVar3 != 0);
  }
  return bVar4;
}

Assistant:

DJGDEF bool djgt_save_png(const djg_texture *texture, const char *filename)
{
    const djg_texture* it = texture->next;
    int cnt = djgt__count(texture);
    char buf[1024];

    if (cnt == 1) {
        sprintf(buf, "%s.png", filename);

        return stbi_write_png(buf, it->x, it->y, it->comp, it->texels, 0);
    } else {
        int i = 1;

        while (it) {
            sprintf(buf, "%s_layer%03i.png", filename, i);

            ++i;
            if (!stbi_write_png(buf, it->x, it->y, it->comp, it->texels, 0))
                return false;
        }
    }

    return true;
}